

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SPIRExpression * __thiscall
diligent_spirv_cross::CompilerGLSL::emit_uninitialized_temporary_expression
          (CompilerGLSL *this,uint32_t type,uint32_t id)

{
  uint32_t id_00;
  SPIRExpression *pSVar1;
  __node_gen_type __node_gen;
  bool local_49;
  uint32_t local_48;
  uint32_t local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&(this->super_Compiler).forced_temporaries;
  local_48 = id;
  local_44 = type;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            (local_40._M_dataplus._M_p,
             (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_48);
  emit_uninitialized_temporary(this,local_44,local_48);
  id_00 = local_48;
  (*(this->super_Compiler)._vptr_Compiler[6])(&local_40,this,(ulong)local_48,1);
  local_49 = true;
  pSVar1 = Compiler::
           set<diligent_spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                     (&this->super_Compiler,id_00,&local_40,&local_44,&local_49);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return pSVar1;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_uninitialized_temporary_expression(uint32_t type, uint32_t id)
{
	forced_temporaries.insert(id);
	emit_uninitialized_temporary(type, id);
	return set<SPIRExpression>(id, to_name(id), type, true);
}